

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

void __thiscall
nonstd::optional_lite::detail::
storage_t<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::destruct_value(storage_t<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *this)

{
  std::
  vector<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
  ::~vector((vector<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
             *)(this + 0x28));
  if (*(storage_t<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        **)this != this + 0x10) {
    operator_delete(*(storage_t<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      **)this,*(long *)(this + 0x10) + 1);
    return;
  }
  return;
}

Assistant:

void destruct_value()
    {
        value_ptr()->~T();
    }